

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::TryGetLastDataItemIndex
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,ES5Array *arr,uint32 first,
          uint32 *lastIndex)

{
  bool bVar1;
  undefined1 local_50 [8];
  ArrayElementEnumerator e;
  uint32 index;
  uint32 *lastIndex_local;
  uint32 first_local;
  ES5Array *arr_local;
  ES5ArrayTypeHandlerBase<unsigned_short> *this_local;
  
  e.end = 0xffffffff;
  Js::JavascriptArray::ArrayElementEnumerator::ArrayElementEnumerator
            ((ArrayElementEnumerator *)local_50,&arr->super_JavascriptArray,first,0xffffffff);
  while (bVar1 = Js::JavascriptArray::ArrayElementEnumerator::MoveNext<void*>
                           ((ArrayElementEnumerator *)local_50), bVar1) {
    e.end = Js::JavascriptArray::ArrayElementEnumerator::GetIndex
                      ((ArrayElementEnumerator *)local_50);
  }
  if (e.end != 0xffffffff) {
    *lastIndex = e.end;
  }
  return e.end != 0xffffffff;
}

Assistant:

bool ES5ArrayTypeHandlerBase<T>::TryGetLastDataItemIndex(ES5Array* arr, uint32 first, uint32* lastIndex)
    {
        uint32 index = JavascriptArray::InvalidIndex;

        JavascriptArray::ArrayElementEnumerator e(arr, first);
        while (e.MoveNext<Var>())
        {
            index = e.GetIndex();
        }

        if (index != JavascriptArray::InvalidIndex)
        {
            *lastIndex = index;
            return true;
        }

        return false;
    }